

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateMethodSignatures
          (ServiceGenerator *this,VirtualOrNot virtual_or_not,Printer *printer)

{
  long *plVar1;
  MethodDescriptor *pMVar2;
  cpp *pcVar3;
  char *options;
  long lVar4;
  ServiceDescriptor *this_00;
  anon_class_1_0_00000001 local_4e9;
  Sub *local_4e8;
  Sub *local_4e0;
  int local_4d4;
  string local_4d0;
  string local_4b0;
  string local_490;
  undefined1 local_470 [32];
  string local_450;
  Options *local_430;
  char *local_428;
  Printer *local_420;
  Options *local_418;
  undefined1 local_410 [8];
  string local_408;
  string local_3e8;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  this_00 = this->descriptor_;
  if (0 < *(int *)(this_00 + 0x38)) {
    local_4e0 = &local_258;
    local_4e8 = &local_1a0;
    options = "";
    local_428 = "";
    if (virtual_or_not == kVirtual) {
      local_428 = "virtual";
    }
    else {
      options = "override";
    }
    local_4d4 = 0;
    local_430 = (Options *)options;
    local_420 = printer;
    do {
      pMVar2 = ServiceDescriptor::method(this_00,local_4d4);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"name","");
      io::Printer::Sub::Sub<std::__cxx11::string_const&>
                (&local_3c8,&local_450,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pMVar2 + 8)
                );
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"input","");
      pcVar3 = (cpp *)google::protobuf::MethodDescriptor::input_type();
      QualifiedClassName_abi_cxx11_
                (&local_3e8,pcVar3,(Descriptor *)this->options_,(Options *)options);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_4b0,&local_3e8);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"output","");
      pcVar3 = (cpp *)google::protobuf::MethodDescriptor::output_type();
      QualifiedClassName_abi_cxx11_
                (&local_408,pcVar3,(Descriptor *)this->options_,(Options *)options);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,&local_4d0,&local_408);
      local_470._0_8_ = local_470 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_470,"virtual","");
      local_410 = (undefined1  [8])local_428;
      io::Printer::Sub::Sub<char_const*>(&local_1a0,(string *)local_470,(char **)local_410);
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"override","");
      local_418 = local_430;
      io::Printer::Sub::Sub<char_const*>(&local_e8,&local_490,(char **)&local_418);
      options = (char *)0x10d;
      google::protobuf::io::Printer::Emit
                (local_420,&local_3c8,5,0x10d,
                 "\n          $virtual $void $name$(::$proto_ns$::RpcController* controller,\n                                const $input$* request,\n                                $output$* response,\n                                ::google::protobuf::Closure* done)$ override$;\n        "
                );
      lVar4 = 0x398;
      do {
        if (local_3e8.field_2._M_local_buf[lVar4 + 8] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_410 + lVar4));
        }
        plVar1 = *(long **)((long)&local_450.field_2 + lVar4 + 8);
        if ((long *)((long)&local_428 + lVar4) != plVar1) {
          operator_delete(plVar1,*(long *)((long)&local_428 + lVar4) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)local_450.field_2._M_local_buf[lVar4]]._M_data)
                  (&local_4e9,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_470 + lVar4 + 0x10));
        local_450.field_2._M_local_buf[lVar4] = -1;
        if ((long *)(local_470 + lVar4) != *(long **)(local_470 + lVar4 + -0x10)) {
          operator_delete(*(long **)(local_470 + lVar4 + -0x10),*(long *)(local_470 + lVar4) + 1);
        }
        lVar4 = lVar4 + -0xb8;
      } while (lVar4 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
        operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      local_4d4 = local_4d4 + 1;
      this_00 = this->descriptor_;
    } while (local_4d4 < *(int *)(this_00 + 0x38));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateMethodSignatures(VirtualOrNot virtual_or_not,
                                                io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); ++i) {
    const MethodDescriptor* method = descriptor_->method(i);

    printer->Emit(
        {
            {"name", method->name()},
            {"input", QualifiedClassName(method->input_type(), *options_)},
            {"output", QualifiedClassName(method->output_type(), *options_)},
            {"virtual", virtual_or_not == kVirtual ? "virtual" : ""},
            {"override", virtual_or_not != kVirtual ? "override" : ""},
        },
        // No cc, clang-format does not format this string well due to the
        // $ override$ substitution.
        R"(
          $virtual $void $name$(::$proto_ns$::RpcController* controller,
                                const $input$* request,
                                $output$* response,
                                ::google::protobuf::Closure* done)$ override$;
        )");
  }
}